

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::TreeEnsembleRegressor::SerializeWithCachedSizes
          (TreeEnsembleRegressor *this,CodedOutputStream *output)

{
  bool bVar1;
  TreeEnsemblePostEvaluationTransform TVar2;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  TreeEnsembleRegressor *this_local;
  
  bVar1 = has_treeensemble(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (1,&this->treeensemble_->super_MessageLite,output);
  }
  TVar2 = postevaluationtransform(this);
  if (TVar2 != NoTransform) {
    TVar2 = postevaluationtransform(this);
    google::protobuf::internal::WireFormatLite::WriteEnum(2,TVar2,output);
  }
  return;
}

Assistant:

void TreeEnsembleRegressor::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.TreeEnsembleRegressor)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.TreeEnsembleParameters treeEnsemble = 1;
  if (this->has_treeensemble()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, *this->treeensemble_, output);
  }

  // .CoreML.Specification.TreeEnsemblePostEvaluationTransform postEvaluationTransform = 2;
  if (this->postevaluationtransform() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      2, this->postevaluationtransform(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.TreeEnsembleRegressor)
}